

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Vec_IntPermute(Vec_Int_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  time_t tVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = p->nSize;
  piVar3 = p->pArray;
  uVar7 = 0;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar4 = rand();
    iVar2 = piVar3[uVar7];
    piVar3[uVar7] = piVar3[iVar4 % (int)uVar1];
    piVar3[iVar4 % (int)uVar1] = iVar2;
  }
  return;
}

Assistant:

void Vec_IntPermute( Vec_Int_t * p )
{
    int i, nSize = Vec_IntSize( p );
    int * pArray = Vec_IntArray( p );
    srand( time(NULL) );
    for ( i = 0; i < nSize; i++ )
    {
        int j = rand()%nSize;
        ABC_SWAP( int, pArray[i], pArray[j] );
    }
}